

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternMemberInfo,_false,_false>::grow_and_add
          (FastVector<ExternMemberInfo,_false,_false> *this,uint newSize,ExternMemberInfo *valPtr,
          uint elem)

{
  uint uVar1;
  uint uVar2;
  ExternMemberInfo *ptr;
  ExternMemberInfo *pEVar3;
  ExternMemberInfo *pEVar4;
  uint local_38;
  uint i;
  uint oldMax;
  ExternMemberInfo *oldData;
  uint elem_local;
  ExternMemberInfo *valPtr_local;
  uint newSize_local;
  FastVector<ExternMemberInfo,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  for (local_38 = 0; local_38 < elem; local_38 = local_38 + 1) {
    pEVar4 = valPtr + local_38;
    uVar2 = this->count;
    this->count = uVar2 + 1;
    pEVar3 = this->data + uVar2;
    uVar2 = pEVar4->alignment;
    pEVar3->type = pEVar4->type;
    pEVar3->alignment = uVar2;
    pEVar3->offset = pEVar4->offset;
  }
  if (ptr != (ExternMemberInfo *)0x0) {
    NULLC::destruct<ExternMemberInfo>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}